

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

int lzham::lzham_lib_z_inflate(lzham_z_streamp pStream,int flush)

{
  long lVar1;
  lzham_uint8 *pOut_buf;
  size_t *pOut_buf_size;
  int in_ESI;
  long *in_RDI;
  lzham_bool no_more_input_bytes_flag;
  size_t out_bytes;
  size_t in_bytes;
  lzham_decompress_status_t status;
  lzham_decompressor *pDecomp;
  lzham_decompress_state_ptr pState;
  size_t orig_avail_in;
  undefined4 in_stack_ffffffffffffffc8;
  lzham_decompress_status_t in_stack_ffffffffffffffcc;
  lzham_uint8 *pIn_buf;
  lzham_uint8 *p;
  int local_14;
  uint local_4;
  
  if ((in_RDI == (long *)0x0) || (in_RDI[7] == 0)) {
    local_4 = 0xfffffffe;
  }
  else {
    if ((in_ESI == 1) || (local_14 = in_ESI, in_ESI == 3)) {
      local_14 = 2;
    }
    if (((local_14 == 0) || (local_14 == 2)) || (local_14 == 4)) {
      lVar1 = in_RDI[1];
      pIn_buf = (lzham_uint8 *)in_RDI[7];
      if (*(int *)(pIn_buf + 0x704) < 3) {
        if ((*(int *)(pIn_buf + 0x70c) == 0) || (local_14 == 4)) {
          *(uint *)(pIn_buf + 0x70c) = (uint)(local_14 == 4) | *(uint *)(pIn_buf + 0x70c);
          p = pIn_buf;
          do {
            while( true ) {
              pOut_buf = (lzham_uint8 *)(ulong)*(uint *)(in_RDI + 1);
              pOut_buf_size = (size_t *)(ulong)*(uint *)(in_RDI + 4);
              in_stack_ffffffffffffffcc =
                   lzham_lib_decompress
                             (p,pIn_buf,
                              (size_t *)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),pOut_buf
                              ,pOut_buf_size,(uint)(local_14 == 4));
              *(lzham_decompress_status_t *)(pIn_buf + 0x704) = in_stack_ffffffffffffffcc;
              *in_RDI = *in_RDI + ((ulong)pOut_buf & 0xffffffff);
              *(int *)(in_RDI + 1) = (int)in_RDI[1] - (int)pOut_buf;
              in_RDI[2] = ((ulong)pOut_buf & 0xffffffff) + in_RDI[2];
              in_RDI[0xc] = (ulong)*(uint *)(pIn_buf + 0xf8);
              in_RDI[3] = in_RDI[3] + ((ulong)pOut_buf_size & 0xffffffff);
              *(int *)(in_RDI + 4) = (int)in_RDI[4] - (int)pOut_buf_size;
              in_RDI[5] = ((ulong)pOut_buf_size & 0xffffffff) + in_RDI[5];
              if (3 < (int)in_stack_ffffffffffffffcc) {
                if (in_stack_ffffffffffffffcc == LZHAM_DECOMP_STATUS_FAILED_NEED_SEED_BYTES) {
                  return 2;
                }
                return -3;
              }
              if ((in_stack_ffffffffffffffcc == LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT) &&
                 ((int)lVar1 == 0)) {
                return -5;
              }
              if (local_14 != 4) break;
              if (in_stack_ffffffffffffffcc == LZHAM_DECOMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
                return 1;
              }
              if (in_stack_ffffffffffffffcc == LZHAM_DECOMP_STATUS_HAS_MORE_OUTPUT) {
                return -5;
              }
            }
          } while (((in_stack_ffffffffffffffcc != LZHAM_DECOMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE)
                   && ((int)in_RDI[1] != 0)) && ((int)in_RDI[4] != 0));
          local_4 = (uint)(in_stack_ffffffffffffffcc ==
                          LZHAM_DECOMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE);
        }
        else {
          local_4 = 0xfffffffe;
        }
      }
      else {
        local_4 = 0xfffffffd;
      }
    }
    else {
      local_4 = 0xfffffffe;
    }
  }
  return local_4;
}

Assistant:

int LZHAM_CDECL lzham_lib_z_inflate(lzham_z_streamp pStream, int flush)
   {
      if ((!pStream) || (!pStream->state)) 
         return LZHAM_Z_STREAM_ERROR;
            
      if ((flush == LZHAM_Z_PARTIAL_FLUSH) || (flush == LZHAM_Z_FULL_FLUSH))
         flush = LZHAM_Z_SYNC_FLUSH;
      if (flush)
      {
         if ((flush != LZHAM_Z_SYNC_FLUSH) && (flush != LZHAM_Z_FINISH)) 
            return LZHAM_Z_STREAM_ERROR;
      }

      size_t orig_avail_in = pStream->avail_in;

      lzham_decompress_state_ptr pState = static_cast<lzham_decompress_state_ptr>(pStream->state);
      lzham_decompressor *pDecomp = static_cast<lzham_decompressor *>(pState);
      if (pDecomp->m_z_last_status >= LZHAM_DECOMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE)
         return LZHAM_Z_DATA_ERROR;

      if (pDecomp->m_z_has_flushed && (flush != LZHAM_Z_FINISH)) 
         return LZHAM_Z_STREAM_ERROR;
      pDecomp->m_z_has_flushed |= (flush == LZHAM_Z_FINISH);

      lzham_decompress_status_t status;
      for ( ; ; )
      {
         size_t in_bytes = pStream->avail_in;
         size_t out_bytes = pStream->avail_out;
         lzham_bool no_more_input_bytes_flag = (flush == LZHAM_Z_FINISH);
         status = lzham_lib_decompress(pState, pStream->next_in, &in_bytes, pStream->next_out, &out_bytes, no_more_input_bytes_flag);
         
         pDecomp->m_z_last_status = status;

         pStream->next_in += (uint)in_bytes; 
         pStream->avail_in -= (uint)in_bytes;
         pStream->total_in += (uint)in_bytes; 
         pStream->adler = pDecomp->m_decomp_adler32;

         pStream->next_out += (uint)out_bytes;
         pStream->avail_out -= (uint)out_bytes;
         pStream->total_out += (uint)out_bytes;
                  
         if (status >= LZHAM_DECOMP_STATUS_FIRST_FAILURE_CODE)
         {
            if (status == LZHAM_DECOMP_STATUS_FAILED_NEED_SEED_BYTES)
               return LZHAM_Z_NEED_DICT;
            else 
               return LZHAM_Z_DATA_ERROR; // Stream is corrupted (there could be some uncompressed data left in the output dictionary - oh well).
         }
         
         if ((status == LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT) && (!orig_avail_in))
            return LZHAM_Z_BUF_ERROR; // Signal caller that we can't make forward progress without supplying more input, or by setting flush to LZHAM_Z_FINISH.
         else if (flush == LZHAM_Z_FINISH)
         {
            // Caller has indicated that all remaining input was at next_in, and all remaining output will fit entirely in next_out.
            // (The output buffer at next_out MUST be large to hold the remaining uncompressed data when flush==LZHAM_Z_FINISH).
            if (status == LZHAM_DECOMP_STATUS_SUCCESS)
               return LZHAM_Z_STREAM_END;
            // If status is LZHAM_DECOMP_STATUS_HAS_MORE_OUTPUT, there must be at least 1 more byte on the way but the caller to lzham_decompress() supplied an empty output buffer.
            // Something is wrong because the caller's output buffer should be large enough to hold the entire decompressed stream when flush==LZHAM_Z_FINISH.
            else if (status == LZHAM_DECOMP_STATUS_HAS_MORE_OUTPUT)
               return LZHAM_Z_BUF_ERROR;
         }
         else if ((status == LZHAM_DECOMP_STATUS_SUCCESS) || (!pStream->avail_in) || (!pStream->avail_out))
            break;
      }

      return (status == LZHAM_DECOMP_STATUS_SUCCESS) ? LZHAM_Z_STREAM_END : LZHAM_Z_OK;
   }